

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::CheckForSemicolon(XFileParser *this)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  
  if (this->mIsBinaryFormat == false) {
    GetNextToken_abi_cxx11_(&local_38,this);
    bVar1 = std::operator!=(&local_38,";");
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Semicolon expected.",&local_39);
      ThrowException(this,&local_38);
    }
  }
  return;
}

Assistant:

void XFileParser::CheckForSemicolon()
{
    if( mIsBinaryFormat)
        return;

    if( GetNextToken() != ";")
        ThrowException( "Semicolon expected.");
}